

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void array_run_container_lazy_xor
               (array_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  bool bVar1;
  int local_28;
  int local_24;
  int32_t arraypos;
  int32_t rlepos;
  run_container_t *dst_local;
  run_container_t *src_2_local;
  array_container_t *src_1_local;
  
  run_container_grow(dst,src_1->cardinality + src_2->n_runs,false);
  local_24 = 0;
  local_28 = 0;
  dst->n_runs = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < src_2->n_runs) {
      bVar1 = local_28 < src_1->cardinality;
    }
    if (!bVar1) break;
    if (src_1->array[local_28] < src_2->runs[local_24].value) {
      run_container_smart_append_exclusive(dst,src_1->array[local_28],0);
      local_28 = local_28 + 1;
    }
    else {
      run_container_smart_append_exclusive
                (dst,src_2->runs[local_24].value,src_2->runs[local_24].length);
      local_24 = local_24 + 1;
    }
  }
  for (; local_28 < src_1->cardinality; local_28 = local_28 + 1) {
    run_container_smart_append_exclusive(dst,src_1->array[local_28],0);
  }
  for (; local_24 < src_2->n_runs; local_24 = local_24 + 1) {
    run_container_smart_append_exclusive
              (dst,src_2->runs[local_24].value,src_2->runs[local_24].length);
  }
  return;
}

Assistant:

void array_run_container_lazy_xor(const array_container_t *src_1,
                                  const run_container_t *src_2,
                                  run_container_t *dst) {
    run_container_grow(dst, src_1->cardinality + src_2->n_runs, false);
    int32_t rlepos = 0;
    int32_t arraypos = 0;
    dst->n_runs = 0;

    while ((rlepos < src_2->n_runs) && (arraypos < src_1->cardinality)) {
        if (src_2->runs[rlepos].value <= src_1->array[arraypos]) {
            run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                                 src_2->runs[rlepos].length);
            rlepos++;
        } else {
            run_container_smart_append_exclusive(dst, src_1->array[arraypos],
                                                 0);
            arraypos++;
        }
    }
    while (arraypos < src_1->cardinality) {
        run_container_smart_append_exclusive(dst, src_1->array[arraypos], 0);
        arraypos++;
    }
    while (rlepos < src_2->n_runs) {
        run_container_smart_append_exclusive(dst, src_2->runs[rlepos].value,
                                             src_2->runs[rlepos].length);
        rlepos++;
    }
}